

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O1

void __thiscall
kj::_::ExclusiveJoinPromiseNode::get(ExclusiveJoinPromiseNode *this,ExceptionOrValue *output)

{
  PromiseNode *pPVar1;
  bool local_9;
  Fault f;
  
  pPVar1 = (this->left).dependency.ptr;
  if ((pPVar1 == (PromiseNode *)0x0) &&
     (pPVar1 = (this->right).dependency.ptr, pPVar1 == (PromiseNode *)0x0)) {
    local_9 = false;
    Debug::Fault::Fault<kj::Exception::Type,bool&,char_const(&)[27]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
               ,0xaad,FAILED,"left.get(output) || right.get(output)",
               "_kjCondition,\"get() called before ready.\"",&local_9,
               (char (*) [27])"get() called before ready.");
    Debug::Fault::fatal(&f);
  }
  (*(pPVar1->super_PromiseArenaMember)._vptr_PromiseArenaMember[3])();
  return;
}

Assistant:

void ExclusiveJoinPromiseNode::get(ExceptionOrValue& output) noexcept {
  KJ_REQUIRE(left.get(output) || right.get(output), "get() called before ready.");
}